

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O1

void I_InitMusic(void)

{
  int iVar1;
  uint uVar2;
  
  Timidity::LoadConfig();
  if (snd_musicvolume.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
    (*snd_musicvolume.super_FBaseCVar.m_Callback)(&snd_musicvolume.super_FBaseCVar);
  }
  uVar2 = 1;
  iVar1 = DArgs::CheckParm(Args,"-nomusic",1);
  if (iVar1 == 0) {
    iVar1 = DArgs::CheckParm(Args,"-nosound",1);
    uVar2 = (uint)(iVar1 != 0);
  }
  nomusic = uVar2;
  if (I_InitMusic()::setatterm == '\0') {
    I_InitMusic()::setatterm = '\x01';
    addterm(I_ShutdownMusicExit,"I_ShutdownMusicExit");
    signal(0x11,ChildSigHandler);
  }
  MusicDown = 1;
  return;
}

Assistant:

void I_InitMusic (void)
{
	static bool setatterm = false;

	Timidity::LoadConfig();

	snd_musicvolume.Callback ();

	nomusic = !!Args->CheckParm("-nomusic") || !!Args->CheckParm("-nosound");

#ifdef _WIN32
	I_InitMusicWin32 ();
#endif // _WIN32
	
	if (!setatterm)
	{
		setatterm = true;
		atterm (I_ShutdownMusicExit);
	
#ifndef _WIN32
		signal (SIGCHLD, ChildSigHandler);
#endif
	}
	MusicDown = false;
}